

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O1

int green_poller_rem(green_poller_t poller,green_future_t future)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  
  fwrite("green_poller_rem()\n",0x13,1,_stderr);
  if (future == (green_future_t)0x0 || poller == (green_poller_t)0x0) {
    iVar1 = 1;
  }
  else {
    if (future->poller == poller) {
      if (poller->refs < 1) {
        pcVar3 = "poller->refs > 0";
        uVar4 = 0x1fe;
      }
      else if (future->refs < 1) {
        pcVar3 = "future->refs > 0";
        uVar4 = 0x1ff;
      }
      else if (poller->loop == future->loop) {
        iVar1 = future->slot;
        if ((long)iVar1 < 0) {
          pcVar3 = "future->slot >= 0";
          uVar4 = 0x202;
        }
        else if ((ulong)(long)iVar1 < poller->busy) {
          if (future->state == green_future_pending) {
            sVar2 = poller->busy - 1;
            poller->busy = sVar2;
            green_poller_swap(poller,iVar1,(int)sVar2);
            iVar1 = (int)poller->busy;
LAB_0010298d:
            green_poller_swap(poller,iVar1,(int)poller->used + -1);
            future->slot = -1;
            future->poller = (green_poller_t)0x0;
            sVar2 = poller->used;
            poller->used = sVar2 - 1;
            poller->futures[sVar2 - 1] = (green_future_t)0x0;
            green_future_release(future);
            return 0;
          }
          pcVar3 = "future->state == green_future_pending";
          uVar4 = 0x209;
        }
        else {
          if (future->state != green_future_pending) goto LAB_0010298d;
          pcVar3 = "future->state != green_future_pending";
          uVar4 = 0x205;
        }
      }
      else {
        pcVar3 = "poller->loop == future->loop";
        uVar4 = 0x200;
      }
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n",pcVar3,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,uVar4);
      fflush(_stderr);
      abort();
    }
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

int green_poller_rem(green_poller_t poller, green_future_t future)
{
    fprintf(stderr, "green_poller_rem()\n");
    if ((poller == NULL) || (future == NULL)) {
        return GREEN_EINVAL;
    }
    if (future->poller != poller) {
        return GREEN_ENOENT;
    }

    green_assert(poller->refs > 0);
    green_assert(future->refs > 0);
    green_assert(poller->loop == future->loop);
    green_assert(future->poller == poller);
    green_assert(future->slot >= 0);

    if (future->slot >= poller->busy) {
        green_assert(future->state != green_future_pending);
        green_poller_swap(poller, future->slot, poller->used-1);
    }
    else {
        green_assert(future->state == green_future_pending);
        green_poller_swap(poller, future->slot, --poller->busy);
        green_poller_swap(poller, poller->busy, poller->used-1);
    }
    future->slot = -1;
    future->poller = NULL;
    poller->futures[--poller->used] = NULL;
    green_future_release(future);
    return GREEN_SUCCESS;
}